

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error sdf_conic_to(FT_26D6_Vec *control_1,FT_26D6_Vec *to,void *user)

{
  long *plVar1;
  FT_Memory memory;
  FT_Error error;
  SDF_Contour *contour;
  SDF_Edge *edge;
  SDF_Shape *shape;
  void *user_local;
  FT_26D6_Vec *to_local;
  FT_26D6_Vec *control_1_local;
  
  contour = (SDF_Contour *)0x0;
  memory._4_4_ = 0;
  if (((control_1 == (FT_26D6_Vec *)0x0) || (to == (FT_26D6_Vec *)0x0)) || (user == (void *)0x0)) {
    memory._4_4_ = 6;
  }
  else {
    plVar1 = *(long **)((long)user + 8);
    edge = (SDF_Edge *)user;
    shape = (SDF_Shape *)user;
    user_local = to;
    to_local = control_1;
    if (((*plVar1 == control_1->x) && (plVar1[1] == control_1->y)) ||
       ((control_1->x == to->x && (control_1->y == to->y)))) {
      sdf_line_to(to,user);
    }
    else {
      memory._4_4_ = sdf_edge_new(*user,(SDF_Edge **)&contour);
      if (memory._4_4_ == 0) {
        *(undefined4 *)&contour[2].last_pos.x = 2;
        (contour->last_pos).x = *plVar1;
        (contour->last_pos).y = plVar1[1];
        contour[1].last_pos.x = to_local->x;
        contour[1].last_pos.y = to_local->y;
        contour->edges = *user_local;
        contour->next = *(SDF_Contour_ **)((long)user_local + 8);
        contour[2].last_pos.y = plVar1[2];
        plVar1[2] = (long)contour;
        *plVar1 = *user_local;
        plVar1[1] = *(long *)((long)user_local + 8);
      }
    }
  }
  return memory._4_4_;
}

Assistant:

static FT_Error
  sdf_conic_to( const FT_26D6_Vec*  control_1,
                const FT_26D6_Vec*  to,
                void*               user )
  {
    SDF_Shape*    shape    = ( SDF_Shape* )user;
    SDF_Edge*     edge     = NULL;
    SDF_Contour*  contour  = NULL;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = shape->memory;


    if ( !control_1 || !to || !user )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    contour = shape->contours;

    /* If the control point coincides with any of the end points */
    /* then it is a line and should be treated as one to avoid   */
    /* unnecessary complexity later in the algorithm.            */
    if ( ( contour->last_pos.x == control_1->x &&
           contour->last_pos.y == control_1->y ) ||
         ( control_1->x == to->x &&
           control_1->y == to->y )               )
    {
      sdf_line_to( to, user );
      goto Exit;
    }

    FT_CALL( sdf_edge_new( memory, &edge ) );

    edge->edge_type = SDF_EDGE_CONIC;
    edge->start_pos = contour->last_pos;
    edge->control_a = *control_1;
    edge->end_pos   = *to;

    edge->next        = contour->edges;
    contour->edges    = edge;
    contour->last_pos = *to;

  Exit:
    return error;
  }